

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O3

RtAudioErrorType __thiscall
RtApi::openStream(RtApi *this,StreamParameters *oParams,StreamParameters *iParams,
                 RtAudioFormat format,uint sampleRate,uint *bufferFrames,RtAudioCallback callback,
                 void *userData,StreamOptions *options)

{
  pointer pDVar1;
  pointer pDVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  RtAudioErrorType RVar10;
  RtAudioErrorType type;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  
  if ((this->stream_).state != STREAM_CLOSED) {
    std::__cxx11::string::_M_replace
              ((ulong)&this->errorText_,0,(char *)(this->errorText_)._M_string_length,0x1f22a2);
    RVar10 = RTAUDIO_INVALID_USE;
    type = RTAUDIO_INVALID_USE;
    goto LAB_00187886;
  }
  clearStreamInfo(this);
  if (oParams == (StreamParameters *)0x0) {
    if (iParams == (StreamParameters *)0x0) {
      pcVar9 = (char *)(this->errorText_)._M_string_length;
      pcVar8 = "RtApi::openStream: input and output StreamParameters structures are both NULL!";
    }
    else {
LAB_00187734:
      if (iParams->nChannels != 0) {
        bVar14 = false;
        goto LAB_00187748;
      }
      pcVar9 = (char *)(this->errorText_)._M_string_length;
      pcVar8 = 
      "RtApi::openStream: a non-NULL input StreamParameters structure cannot have an nChannels value less than one."
      ;
    }
LAB_00187872:
    std::__cxx11::string::_M_replace((ulong)&this->errorText_,0,pcVar9,(ulong)pcVar8);
  }
  else {
    if (oParams->nChannels == 0) {
      pcVar9 = (char *)(this->errorText_)._M_string_length;
      pcVar8 = 
      "RtApi::openStream: a non-NULL output StreamParameters structure cannot have an nChannels value less than one."
      ;
      goto LAB_00187872;
    }
    if (iParams != (StreamParameters *)0x0) goto LAB_00187734;
    bVar14 = true;
LAB_00187748:
    uVar4 = formatBytes(this,format);
    if (uVar4 == 0) {
      pcVar9 = (char *)(this->errorText_)._M_string_length;
      pcVar8 = "RtApi::openStream: \'format\' parameter value is undefined.";
      goto LAB_00187872;
    }
    if ((this->deviceList_).
        super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (this->deviceList_).
        super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
        super__Vector_impl_data._M_start) {
      (*this->_vptr_RtApi[0xb])(this);
    }
    uVar4 = 0;
    uVar7 = 0;
    if (oParams != (StreamParameters *)0x0) {
      pDVar1 = (this->deviceList_).
               super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl
               .super__Vector_impl_data._M_start;
      pDVar2 = (this->deviceList_).
               super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl
               .super__Vector_impl_data._M_finish;
      uVar7 = ((long)pDVar2 - (long)pDVar1 >> 5) * -0x5555555555555555;
      if (pDVar2 == pDVar1) {
        uVar6 = 0;
      }
      else {
        uVar6 = 0;
        uVar11 = 1;
        do {
          if (pDVar1[uVar6].ID == oParams->deviceId) break;
          bVar13 = uVar11 <= uVar7;
          lVar3 = uVar7 - uVar11;
          uVar6 = uVar11;
          uVar11 = (ulong)((int)uVar11 + 1);
        } while (bVar13 && lVar3 != 0);
      }
      if (uVar7 - uVar6 == 0) {
        pcVar9 = (char *)(this->errorText_)._M_string_length;
        pcVar8 = "RtApi::openStream: output device ID is invalid.";
        goto LAB_00187872;
      }
      uVar7 = (ulong)oParams->nChannels;
    }
    if (bVar14) {
LAB_0018791d:
      if ((((int)uVar7 == 0) ||
          (iVar5 = (*this->_vptr_RtApi[0xc])
                             (this,(ulong)oParams->deviceId,0,uVar7,(ulong)oParams->firstChannel,
                              sampleRate,format,bufferFrames,options), (char)iVar5 != '\0')) &&
         ((uVar4 == 0 ||
          (iVar5 = (*this->_vptr_RtApi[0xc])
                             (this,(ulong)iParams->deviceId,1,(ulong)uVar4,
                              (ulong)iParams->firstChannel,sampleRate,format,bufferFrames,options),
          (char)iVar5 != '\0')))) {
        (this->stream_).callbackInfo.callback = callback;
        (this->stream_).callbackInfo.userData = userData;
        if (options != (StreamOptions *)0x0) {
          options->numberOfBuffers = (this->stream_).nBuffers;
        }
        (this->stream_).state = STREAM_STOPPED;
        return RTAUDIO_NO_ERROR;
      }
      RVar10 = RTAUDIO_SYSTEM_ERROR;
      type = RTAUDIO_SYSTEM_ERROR;
      goto LAB_00187886;
    }
    pDVar1 = (this->deviceList_).
             super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pDVar2 = (this->deviceList_).
             super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar6 = ((long)pDVar2 - (long)pDVar1 >> 5) * -0x5555555555555555;
    if (pDVar2 == pDVar1) {
      uVar11 = 0;
    }
    else {
      uVar11 = 0;
      uVar12 = 1;
      do {
        if (pDVar1[uVar11].ID == iParams->deviceId) break;
        bVar14 = uVar12 <= uVar6;
        lVar3 = uVar6 - uVar12;
        uVar11 = uVar12;
        uVar12 = (ulong)((int)uVar12 + 1);
      } while (bVar14 && lVar3 != 0);
    }
    if (uVar6 - uVar11 != 0) {
      uVar4 = iParams->nChannels;
      goto LAB_0018791d;
    }
    std::__cxx11::string::operator=
              ((string *)&this->errorText_,"RtApi::openStream: input device ID is invalid.");
  }
  RVar10 = RTAUDIO_INVALID_PARAMETER;
  type = RTAUDIO_INVALID_PARAMETER;
LAB_00187886:
  error(this,type);
  return RVar10;
}

Assistant:

RtAudioErrorType RtApi :: openStream( RtAudio::StreamParameters *oParams,
                                      RtAudio::StreamParameters *iParams,
                                      RtAudioFormat format, unsigned int sampleRate,
                                      unsigned int *bufferFrames,
                                      RtAudioCallback callback, void *userData,
                                      RtAudio::StreamOptions *options )
{
  if ( stream_.state != STREAM_CLOSED ) {
    errorText_ = "RtApi::openStream: a stream is already open!";
    return error( RTAUDIO_INVALID_USE );
  }

  // Clear stream information potentially left from a previously open stream.
  clearStreamInfo();

  if ( oParams && oParams->nChannels < 1 ) {
    errorText_ = "RtApi::openStream: a non-NULL output StreamParameters structure cannot have an nChannels value less than one.";
    return error( RTAUDIO_INVALID_PARAMETER );
  }

  if ( iParams && iParams->nChannels < 1 ) {
    errorText_ = "RtApi::openStream: a non-NULL input StreamParameters structure cannot have an nChannels value less than one.";
    return error( RTAUDIO_INVALID_PARAMETER );
  }

  if ( oParams == NULL && iParams == NULL ) {
    errorText_ = "RtApi::openStream: input and output StreamParameters structures are both NULL!";
    return error( RTAUDIO_INVALID_PARAMETER );
  }

  if ( formatBytes(format) == 0 ) {
    errorText_ = "RtApi::openStream: 'format' parameter value is undefined.";
    return error( RTAUDIO_INVALID_PARAMETER );
  }

  // Scan devices if none currently listed.
  if ( deviceList_.size() == 0 ) probeDevices();
  
  unsigned int m, oChannels = 0;
  if ( oParams ) {
    oChannels = oParams->nChannels;
    // Verify that the oParams->deviceId is found in our list
    for ( m=0; m<deviceList_.size(); m++ ) {
      if ( deviceList_[m].ID == oParams->deviceId ) break;
    }
    if ( m == deviceList_.size() ) {
      errorText_ = "RtApi::openStream: output device ID is invalid.";
      return error( RTAUDIO_INVALID_PARAMETER );
    }
  }

  unsigned int iChannels = 0;
  if ( iParams ) {
    iChannels = iParams->nChannels;
    for ( m=0; m<deviceList_.size(); m++ ) {
      if ( deviceList_[m].ID == iParams->deviceId ) break;
    }
    if ( m == deviceList_.size() ) {
      errorText_ = "RtApi::openStream: input device ID is invalid.";
      return error( RTAUDIO_INVALID_PARAMETER );
    }
  }

  bool result;

  if ( oChannels > 0 ) {

    result = probeDeviceOpen( oParams->deviceId, OUTPUT, oChannels, oParams->firstChannel,
                              sampleRate, format, bufferFrames, options );
    if ( result == false )
      return error( RTAUDIO_SYSTEM_ERROR );
  }

  if ( iChannels > 0 ) {

    result = probeDeviceOpen( iParams->deviceId, INPUT, iChannels, iParams->firstChannel,
                              sampleRate, format, bufferFrames, options );
    if ( result == false )
      return error( RTAUDIO_SYSTEM_ERROR );
  }

  stream_.callbackInfo.callback = (void *) callback;
  stream_.callbackInfo.userData = userData;

  if ( options ) options->numberOfBuffers = stream_.nBuffers;
  stream_.state = STREAM_STOPPED;
  return RTAUDIO_NO_ERROR;
}